

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * __thiscall duckdb_re2::Regexp::ParseState::FinishRegexp(ParseState *this,Regexp *re)

{
  void *pvVar1;
  CharClass *pCVar2;
  Regexp *in_RSI;
  CharClassBuilder *unaff_retaddr;
  CharClassBuilder *ccb;
  Regexp *local_8;
  
  if (in_RSI == (Regexp *)0x0) {
    local_8 = (Regexp *)0x0;
  }
  else {
    in_RSI->down_ = (Regexp *)0x0;
    local_8 = in_RSI;
    if ((in_RSI->op_ == '\x14') && ((in_RSI->arguments).capture.name_ != (string *)0x0)) {
      pvVar1 = (in_RSI->arguments).the_union_[1];
      (in_RSI->arguments).capture.name_ = (string *)0x0;
      pCVar2 = CharClassBuilder::GetCharClass(unaff_retaddr);
      (in_RSI->arguments).char_class.cc_ = pCVar2;
      if (pvVar1 != (void *)0x0) {
        CharClassBuilder::~CharClassBuilder((CharClassBuilder *)0x262f533);
        operator_delete(pvVar1);
      }
    }
  }
  return local_8;
}

Assistant:

Regexp* Regexp::ParseState::FinishRegexp(Regexp* re) {
  if (re == NULL)
    return NULL;
  re->down_ = NULL;

  if (re->op_ == kRegexpCharClass && re->arguments.char_class.ccb_ != NULL) {
    CharClassBuilder* ccb = re->arguments.char_class.ccb_;
    re->arguments.char_class.ccb_ = NULL;
    re->arguments.char_class.cc_ = ccb->GetCharClass();
    delete ccb;
  }

  return re;
}